

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * iutest::detail::ToHexString<unsigned_int>(string *__return_storage_ptr__,uint value)

{
  char cVar1;
  allocator<char> local_39;
  ulong local_38;
  size_t i;
  char buf [9];
  size_t kN;
  uint value_local;
  
  buf[1] = '\b';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  memset((void *)((long)&i + 7),0,9);
  for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
    cVar1 = ToHex(value >> (('\a' - (char)local_38) * '\x04' & 0x1fU));
    *(char *)((long)&i + local_38 + 7) = cVar1;
  }
  buf[0] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)((long)&i + 7),&local_39);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(T value)
{
    const size_t kN = sizeof(T)*2;
    char buf[kN + 1] = {0};
    for( size_t i=0; i < kN; ++i )
    {
        buf[i] = ToHex(static_cast<unsigned int>((value>>((kN-i-1)*4))));
    }
    buf[kN] = '\0';
    return buf;
}